

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> * __thiscall
tiger::trains::world::World::getEventsAfter
          (vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
           *__return_storage_ptr__,World *this,int startTick)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  iterator __position;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  pointer ppIVar6;
  ulong uVar7;
  IEvent *event;
  IEvent *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (ulong)startTick;
  pvVar3 = (this->eventsHistory).
           super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->eventsHistory).
           super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
  if (uVar7 <= uVar5 && uVar5 - uVar7 != 0) {
    do {
      ppIVar6 = pvVar3[uVar7].
                super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 = *(pointer *)
                 ((long)&pvVar3[uVar7].
                         super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (ppIVar6 != ppIVar2) {
        do {
          local_38 = *ppIVar6;
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<tiger::trains::world::IEvent*,std::allocator<tiger::trains::world::IEvent*>>
            ::_M_realloc_insert<tiger::trains::world::IEvent*const&>
                      ((vector<tiger::trains::world::IEvent*,std::allocator<tiger::trains::world::IEvent*>>
                        *)__return_storage_ptr__,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            pppIVar1 = &(__return_storage_ptr__->
                        super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppIVar1 = *pppIVar1 + 1;
          }
          ppIVar6 = ppIVar6 + 1;
        } while (ppIVar6 != ppIVar2);
        pvVar3 = (this->eventsHistory).
                 super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->eventsHistory).
                 super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<IEvent *> World::getEventsAfter(int startTick) const
{
    std::vector<IEvent *> res;

    for (size_t i=startTick; i<eventsHistory.size(); i++)
        for (IEvent *event: eventsHistory[i])
            res.push_back(event);

    return res;
}